

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void xmlListPopFront(xmlListPtr l)

{
  int iVar1;
  xmlListPtr l_local;
  
  iVar1 = xmlListEmpty(l);
  if (iVar1 == 0) {
    xmlLinkDeallocator(l,l->sentinel->next);
  }
  return;
}

Assistant:

void
xmlListPopFront(xmlListPtr l)
{
    if(!xmlListEmpty(l))
        xmlLinkDeallocator(l, l->sentinel->next);
}